

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::removeInteractionPairs(SimInfo *this,Molecule *mol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ForceField *pFVar4;
  Bond *pBVar5;
  Bend *pBVar6;
  Torsion *pTVar7;
  Inversion *pIVar8;
  pointer ppAVar9;
  int iVar10;
  ulong uVar11;
  StuntDouble *pSVar12;
  long lVar13;
  pointer ppBVar14;
  PairList *pPVar15;
  pointer ppRVar16;
  long lVar17;
  PairList *pPVar18;
  PairList *pPVar19;
  RigidBody *pRVar20;
  PairList *pPVar21;
  void *pvVar22;
  pointer ppIVar23;
  long lVar24;
  pointer ppSVar25;
  pointer ppBVar26;
  pointer ppTVar27;
  long lVar28;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  set<int,_std::less<int>,_std::allocator<int>_> rigidAtoms;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms_1;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  atomGroups;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_e8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d0;
  undefined1 local_a0 [8];
  undefined1 local_98 [48];
  PairList *local_68;
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_60;
  
  pFVar4 = this->forceField_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar25 = (mol->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((ppSVar25 !=
       (mol->integrableObjects_).
       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pSVar12 = *ppSVar25, pSVar12 != (StuntDouble *)0x0)) {
    do {
      if (pSVar12->objType_ == otRigidBody) {
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                  (&local_e8,
                   (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&pSVar12[2].mass_);
        local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d0._M_impl.super__Rb_tree_header._M_header;
        local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (0 < (int)((ulong)((long)local_e8.
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_e8.
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar13 = 0;
          do {
            local_a0._0_4_ =
                 (local_e8.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13]->super_StuntDouble).globalIndex_;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&local_d0,(int *)local_a0);
            lVar13 = lVar13 + 1;
            iVar10 = (int)((ulong)((long)local_e8.
                                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_e8.
                                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
          } while (lVar13 < iVar10);
          if (0 < iVar10) {
            lVar13 = 0;
            do {
              local_a0._0_4_ =
                   (local_e8.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar13]->super_StuntDouble).
                   globalIndex_;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)local_98,&local_d0);
              std::
              _Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
              ::
              _M_insert_unique<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>
                        ((_Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                          *)&local_60,
                         (pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                         local_a0);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)local_98);
              lVar13 = lVar13 + 1;
            } while (lVar13 < (int)((ulong)((long)local_e8.
                                                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_e8.
                                                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
          }
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_d0);
        if (local_e8.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d0._M_impl.super__Rb_tree_header._M_header;
        local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a0._0_4_ = pSVar12->globalIndex_;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_d0,(int *)local_a0);
        local_a0._0_4_ = pSVar12->globalIndex_;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_98,&local_d0);
        std::
        _Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>
                  ((_Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                    *)&local_60,
                   (pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_a0
                  );
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_98);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_d0);
      }
      ppSVar25 = ppSVar25 + 1;
    } while ((ppSVar25 !=
              (mol->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) &&
            (pSVar12 = *ppSVar25, pSVar12 != (StuntDouble *)0x0));
  }
  ppBVar14 = (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ppBVar14 !=
       (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pBVar5 = *ppBVar14, pBVar5 != (Bond *)0x0)) {
    do {
      ppBVar14 = ppBVar14 + 1;
      pPVar21 = &this->oneTwoInteractions_;
      if (((pFVar4->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        pPVar21 = &this->excludedInteractions_;
      }
      ppAVar9 = (pBVar5->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      PairList::removePair
                (pPVar21,((*ppAVar9)->super_StuntDouble).globalIndex_,
                 (ppAVar9[1]->super_StuntDouble).globalIndex_);
    } while ((ppBVar14 !=
              (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) &&
            (pBVar5 = *ppBVar14, pBVar5 != (Bond *)0x0));
  }
  ppBVar26 = (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ppBVar26 !=
       (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pBVar6 = *ppBVar26, pBVar6 != (Bend *)0x0)) {
    pPVar21 = &this->excludedInteractions_;
    do {
      ppBVar26 = ppBVar26 + 1;
      ppAVar9 = (pBVar6->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar10 = ((*ppAVar9)->super_StuntDouble).globalIndex_;
      iVar1 = (ppAVar9[1]->super_StuntDouble).globalIndex_;
      iVar2 = (ppAVar9[2]->super_StuntDouble).globalIndex_;
      if (((pFVar4->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar21,iVar10,iVar1);
        pPVar15 = pPVar21;
      }
      else {
        PairList::removePair(&this->oneTwoInteractions_,iVar10,iVar1);
        pPVar15 = &this->oneTwoInteractions_;
      }
      PairList::removePair(pPVar15,iVar1,iVar2);
      pPVar15 = &this->oneThreeInteractions_;
      if (((pFVar4->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
        pPVar15 = pPVar21;
      }
      PairList::removePair(pPVar15,iVar10,iVar2);
    } while ((ppBVar26 !=
              (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) &&
            (pBVar6 = *ppBVar26, pBVar6 != (Bend *)0x0));
  }
  ppTVar27 = (mol->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((ppTVar27 !=
       (mol->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) && (pTVar7 = *ppTVar27, pTVar7 != (Torsion *)0x0))
  {
    pPVar21 = &this->oneTwoInteractions_;
    pPVar15 = &this->excludedInteractions_;
    local_68 = &this->oneThreeInteractions_;
    do {
      ppTVar27 = ppTVar27 + 1;
      ppAVar9 = (pTVar7->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar10 = ((*ppAVar9)->super_StuntDouble).globalIndex_;
      iVar1 = (ppAVar9[1]->super_StuntDouble).globalIndex_;
      iVar2 = (ppAVar9[2]->super_StuntDouble).globalIndex_;
      iVar3 = (ppAVar9[3]->super_StuntDouble).globalIndex_;
      if (((pFVar4->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar15,iVar10,iVar1);
        PairList::removePair(pPVar15,iVar1,iVar2);
        pPVar18 = pPVar15;
      }
      else {
        PairList::removePair(pPVar21,iVar10,iVar1);
        PairList::removePair(pPVar21,iVar1,iVar2);
        pPVar18 = pPVar21;
      }
      PairList::removePair(pPVar18,iVar2,iVar3);
      pPVar18 = local_68;
      if (((pFVar4->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar15,iVar10,iVar2);
        pPVar18 = pPVar15;
      }
      else {
        PairList::removePair(local_68,iVar10,iVar2);
      }
      PairList::removePair(pPVar18,iVar1,iVar3);
      pPVar18 = &this->oneFourInteractions_;
      if (((pFVar4->forceFieldOptions_).vdw14scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic14scale.super_ParameterBase.empty_ != false)) {
        pPVar18 = pPVar15;
      }
      PairList::removePair(pPVar18,iVar10,iVar3);
    } while ((ppTVar27 !=
              (mol->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_finish) && (pTVar7 = *ppTVar27, pTVar7 != (Torsion *)0x0));
  }
  ppIVar23 = (mol->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((ppIVar23 !=
       (mol->inversions_).
       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pIVar8 = *ppIVar23, pIVar8 != (Inversion *)0x0)) {
    pPVar21 = &this->oneTwoInteractions_;
    pPVar15 = &this->excludedInteractions_;
    pPVar18 = &this->oneThreeInteractions_;
    do {
      ppIVar23 = ppIVar23 + 1;
      ppAVar9 = (pIVar8->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar10 = ((*ppAVar9)->super_StuntDouble).globalIndex_;
      iVar1 = (ppAVar9[1]->super_StuntDouble).globalIndex_;
      iVar2 = (ppAVar9[2]->super_StuntDouble).globalIndex_;
      iVar3 = (ppAVar9[3]->super_StuntDouble).globalIndex_;
      if (((pFVar4->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar15,iVar10,iVar1);
        PairList::removePair(pPVar15,iVar10,iVar2);
        pPVar19 = pPVar15;
      }
      else {
        PairList::removePair(pPVar21,iVar10,iVar1);
        PairList::removePair(pPVar21,iVar10,iVar2);
        pPVar19 = pPVar21;
      }
      PairList::removePair(pPVar19,iVar10,iVar3);
      if (((pFVar4->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
         ((pFVar4->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar15,iVar1,iVar2);
        PairList::removePair(pPVar15,iVar1,iVar3);
        pPVar19 = pPVar15;
      }
      else {
        PairList::removePair(pPVar18,iVar1,iVar2);
        PairList::removePair(pPVar18,iVar1,iVar3);
        pPVar19 = pPVar18;
      }
      PairList::removePair(pPVar19,iVar2,iVar3);
    } while ((ppIVar23 !=
              (mol->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_finish) && (pIVar8 = *ppIVar23, pIVar8 != (Inversion *)0x0)
            );
  }
  ppRVar16 = (mol->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((ppRVar16 !=
       (mol->rigidBodies_).
       super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pRVar20 = *ppRVar16, pRVar20 != (RigidBody *)0x0)) {
    do {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)local_a0,
                 &pRVar20->atoms_);
      pvVar22 = (void *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
      if (1 < (int)((ulong)(local_98._0_8_ - (long)pvVar22) >> 3)) {
        lVar17 = 1;
        ppAVar9 = (pointer)local_98._0_8_;
        lVar13 = 0;
        do {
          lVar28 = lVar13 + 1;
          uVar11 = (long)ppAVar9 - (long)pvVar22;
          lVar24 = lVar17;
          if (lVar28 < (int)(uVar11 >> 3)) {
            do {
              PairList::removePair
                        (&this->excludedInteractions_,
                         *(int *)(*(long *)((long)pvVar22 + lVar13 * 8) + 0x28),
                         *(int *)(*(long *)((long)pvVar22 + lVar24 * 8) + 0x28));
              lVar24 = lVar24 + 1;
              pvVar22 = (void *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
              uVar11 = local_98._0_8_ - (long)pvVar22;
              ppAVar9 = (pointer)local_98._0_8_;
            } while (lVar24 < (int)(uVar11 >> 3));
          }
          lVar17 = lVar17 + 1;
          lVar13 = lVar28;
        } while (lVar28 < (long)(uVar11 * 0x20000000 + -0x100000000) >> 0x20);
      }
      if (pvVar22 != (void *)0x0) {
        operator_delete(pvVar22,local_98._8_8_ - (long)pvVar22);
      }
      ppRVar16 = ppRVar16 + 1;
    } while ((ppRVar16 !=
              (mol->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish) &&
            (pRVar20 = *ppRVar16, pRVar20 != (RigidBody *)0x0));
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void SimInfo::removeInteractionPairs(Molecule* mol) {
    ForceFieldOptions& options_ = forceField_->getForceFieldOptions();
    vector<Bond*>::iterator bondIter;
    vector<Bend*>::iterator bendIter;
    vector<Torsion*>::iterator torsionIter;
    vector<Inversion*>::iterator inversionIter;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int a;
    int b;
    int c;
    int d;

    map<int, set<int>> atomGroups;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    for (sd = mol->beginIntegrableObject(ii); sd != NULL;
         sd = mol->nextIntegrableObject(ii)) {
      if (sd->isRigidBody()) {
        rb                  = static_cast<RigidBody*>(sd);
        vector<Atom*> atoms = rb->getAtoms();
        set<int> rigidAtoms;
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          rigidAtoms.insert(atoms[i]->getGlobalIndex());
        }
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          atomGroups.insert(map<int, set<int>>::value_type(
              atoms[i]->getGlobalIndex(), rigidAtoms));
        }
      } else {
        set<int> oneAtomSet;
        oneAtomSet.insert(sd->getGlobalIndex());
        atomGroups.insert(
            map<int, set<int>>::value_type(sd->getGlobalIndex(), oneAtomSet));
      }
    }

    for (bond = mol->beginBond(bondIter); bond != NULL;
         bond = mol->nextBond(bondIter)) {
      a = bond->getAtomA()->getGlobalIndex();
      b = bond->getAtomB()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
      } else {
        excludedInteractions_.removePair(a, b);
      }
    }

    for (bend = mol->beginBend(bendIter); bend != NULL;
         bend = mol->nextBend(bendIter)) {
      a = bend->getAtomA()->getGlobalIndex();
      b = bend->getAtomB()->getGlobalIndex();
      c = bend->getAtomC()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
      } else {
        excludedInteractions_.removePair(a, c);
      }
    }

    for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol->nextTorsion(torsionIter)) {
      a = torsion->getAtomA()->getGlobalIndex();
      b = torsion->getAtomB()->getGlobalIndex();
      c = torsion->getAtomC()->getGlobalIndex();
      d = torsion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
        oneTwoInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(c, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
        oneThreeInteractions_.removePair(b, d);
      } else {
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(b, d);
      }

      if (options_.havevdw14scale() || options_.haveelectrostatic14scale()) {
        oneFourInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, d);
      }
    }

    for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
         inversion = mol->nextInversion(inversionIter)) {
      a = inversion->getAtomA()->getGlobalIndex();
      b = inversion->getAtomB()->getGlobalIndex();
      c = inversion->getAtomC()->getGlobalIndex();
      d = inversion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(a, c);
        oneTwoInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(a, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(b, c);
        oneThreeInteractions_.removePair(b, d);
        oneThreeInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(b, d);
        excludedInteractions_.removePair(c, d);
      }
    }

    for (rb = mol->beginRigidBody(rbIter); rb != NULL;
         rb = mol->nextRigidBody(rbIter)) {
      vector<Atom*> atoms = rb->getAtoms();
      for (int i = 0; i < static_cast<int>(atoms.size()) - 1; ++i) {
        for (int j = i + 1; j < static_cast<int>(atoms.size()); ++j) {
          a = atoms[i]->getGlobalIndex();
          b = atoms[j]->getGlobalIndex();
          excludedInteractions_.removePair(a, b);
        }
      }
    }
  }